

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<true,true,false>(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  bool bVar3;
  const_pointer pcVar4;
  State *pSVar5;
  State *pSVar6;
  State *state;
  uint uVar7;
  const_pointer data;
  uint c;
  size_t sVar8;
  ulong uVar9;
  const_pointer pcVar10;
  long lVar11;
  Prog *local_228;
  const_pointer local_220;
  Prog *local_218;
  StateSaver local_208;
  StateSaver local_1e0;
  Prog *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = (params->text).data_;
  pSVar6 = params->start;
  data = pcVar2 + (params->text).size_;
  if ((pSVar6->flag_ & 0x100) == 0) {
    local_228 = this->prog_;
    local_218 = (Prog *)0x0;
    pcVar10 = (const_pointer)0x0;
    local_220 = (const_pointer)0x0;
    state = pSVar6;
    local_1b8 = local_228;
    do {
      if ((data == pcVar2) ||
         ((pcVar4 = data, state == pSVar6 &&
          (pcVar4 = (const_pointer)Prog::PrefixAccel(this->prog_,data,(long)pcVar2 - (long)data),
          data = pcVar2, pcVar4 == (const_pointer)0x0)))) {
        pcVar4 = (params->text).data_;
        if (pcVar4 == (params->context).data_) {
          c = 0x100;
        }
        else {
          c = (uint)(byte)pcVar4[-1];
        }
        if (c == 0x100) {
          uVar7 = this->prog_->bytemap_range_;
        }
        else {
          uVar7 = (uint)this->prog_->bytemap_[c];
        }
        pSVar6 = state->next_[(int)uVar7]._M_b._M_p;
        if ((pSVar6 == (State *)0x0) &&
           (pSVar6 = RunStateOnByteUnlocked(this,state,c), pSVar6 == (State *)0x0)) {
          if (state < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.dfa_ = this;
            local_208.special_ = state;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = state->ninst_;
            local_208.flag_ = state->flag_;
            lVar11 = (long)local_208.ninst_;
            uVar9 = 0xffffffffffffffff;
            if (-1 < local_208.ninst_) {
              uVar9 = lVar11 * 4;
            }
            local_208.dfa_ = this;
            local_208.inst_ = (int *)operator_new__(uVar9);
            memmove(local_208.inst_,state->inst_,lVar11 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar6 = StateSaver::Restore(&local_208);
          if (pSVar6 == (State *)0x0) {
LAB_01cda384:
            params->failed = true;
            bVar3 = false;
            pSVar6 = (State *)0x0;
            local_228._0_1_ = 0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,c);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_01cda384;
            }
            bVar3 = true;
          }
          if ((local_208.is_special_ == false) && (local_208.inst_ != (int *)0x0)) {
            operator_delete__(local_208.inst_);
          }
          if (!bVar3) break;
        }
        if (pSVar6 < (State *)0x3) {
          if (pSVar6 == (State *)&DAT_00000001) goto LAB_01cda435;
          params->ep = pcVar2;
          goto LAB_01cda223;
        }
        if (((((pSVar6->flag_ & 0x100) == 0) ||
             (local_218._0_1_ = 1, pcVar10 = data, params->matches == (SparseSet *)0x0)) ||
            (this->kind_ != kManyMatch)) || ((long)pSVar6->ninst_ < 1)) goto LAB_01cda435;
        lVar11 = (long)pSVar6->ninst_ + 1;
        goto LAB_01cda3f0;
      }
      data = pcVar4 + -1;
      bVar1 = pcVar4[-1];
      pSVar5 = state->next_[local_1b8->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar5 == (State *)0x0) {
        pSVar5 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
        if (pSVar5 != (State *)0x0) goto LAB_01cd9eca;
        if (((dfa_should_bail_when_slow == '\x01') && (local_220 != (const_pointer)0x0)) &&
           (((ulong)((long)data - (long)local_220) < (this->state_cache_)._M_h._M_element_count * 10
            && (this->kind_ != kManyMatch)))) {
          params->failed = true;
          bVar3 = false;
          local_228 = (Prog *)0x0;
        }
        else {
          if (pSVar6 < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.dfa_ = this;
            local_208.special_ = pSVar6;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = pSVar6->ninst_;
            local_208.flag_ = pSVar6->flag_;
            lVar11 = (long)local_208.ninst_;
            sVar8 = lVar11 * 4;
            if (local_208.ninst_ < 0) {
              sVar8 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_208.inst_ = (int *)operator_new__(sVar8);
            memmove(local_208.inst_,pSVar6->inst_,lVar11 * 4);
          }
          local_1e0.dfa_ = this;
          if (state < (State *)0x3) {
            local_1e0.inst_ = (int *)0x0;
            local_1e0.ninst_ = 0;
            local_1e0.flag_ = 0;
            local_1e0.is_special_ = true;
            local_1e0.special_ = state;
          }
          else {
            local_1e0.is_special_ = false;
            local_1e0.special_ = (State *)0x0;
            local_1e0.ninst_ = state->ninst_;
            local_1e0.flag_ = state->flag_;
            lVar11 = (long)local_1e0.ninst_;
            sVar8 = lVar11 * 4;
            if (local_1e0.ninst_ < 0) {
              sVar8 = 0xffffffffffffffff;
            }
            local_1e0.inst_ = (int *)operator_new__(sVar8);
            memmove(local_1e0.inst_,state->inst_,lVar11 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar6 = StateSaver::Restore(&local_208);
          if (pSVar6 == (State *)0x0) {
LAB_01cda167:
            params->failed = true;
            bVar3 = false;
            pSVar5 = (State *)0x0;
            local_228 = (Prog *)0x0;
          }
          else {
            state = StateSaver::Restore(&local_1e0);
            if (state == (State *)0x0) {
              state = (State *)0x0;
              goto LAB_01cda167;
            }
            pSVar5 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
            if (pSVar5 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_01cda167;
            }
            bVar3 = true;
          }
          if ((local_1e0.is_special_ == false) && (local_1e0.inst_ != (int *)0x0)) {
            operator_delete__(local_1e0.inst_);
          }
          if ((local_208.is_special_ == false) && (local_208.inst_ != (int *)0x0)) {
            operator_delete__(local_208.inst_);
          }
          local_220 = data;
          if (bVar3) goto LAB_01cd9eca;
          bVar3 = false;
        }
      }
      else {
LAB_01cd9eca:
        if (pSVar5 < (State *)0x3) {
          if (pSVar5 == (State *)&DAT_00000001) {
            params->ep = pcVar10;
            goto LAB_01cd9f78;
          }
          params->ep = pcVar2;
          local_228 = (Prog *)0x1;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          state = pSVar5;
          if ((pSVar5->flag_ & 0x100) != 0) {
            if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
               (0 < (long)pSVar5->ninst_)) {
              lVar11 = (long)pSVar5->ninst_ + 1;
              do {
                if (pSVar5->inst_[lVar11 + -2] == -2) break;
                SparseSetT<void>::InsertInternal(params->matches,true,pSVar5->inst_[lVar11 + -2]);
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
            }
            params->ep = pcVar4;
            local_218 = (Prog *)0x1;
            pcVar10 = pcVar4;
LAB_01cd9f78:
            bVar3 = false;
            local_228 = local_218;
          }
        }
      }
    } while (bVar3);
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar6->ninst_)) {
      lVar11 = (long)pSVar6->ninst_ + 1;
      do {
        if (pSVar6->inst_[lVar11 + -2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[lVar11 + -2]);
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
    params->ep = data;
LAB_01cda223:
    local_228._0_1_ = 1;
  }
LAB_01cda447:
  return (bool)((byte)local_228 & 1);
  while( true ) {
    SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[lVar11 + -2]);
    lVar11 = lVar11 + -1;
    if (lVar11 < 2) break;
LAB_01cda3f0:
    if (pSVar6->inst_[lVar11 + -2] == -2) break;
  }
LAB_01cda435:
  params->ep = pcVar10;
  local_228._0_1_ = (byte)local_218;
  goto LAB_01cda447;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}